

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int cat(int argc,char **argv)

{
  WrapMode2D wrapMode;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long in_RSI;
  int in_EDI;
  Bounds2<int> BVar5;
  Bounds2iIterator BVar6;
  Bounds2iIterator BVar7;
  Bounds2iIterator BVar8;
  size_t i_2;
  ImageChannelValues values_1;
  Point2i p_1;
  Bounds2iIterator __end4;
  Bounds2iIterator __begin4;
  Bounds2i *__range4;
  int x;
  int y;
  int vb;
  int va;
  size_t i_1;
  ImageChannelValues *values;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *v_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
  *__range3_1;
  ImageChannelValues v;
  Point2i p;
  Bounds2iIterator __end3;
  Bounds2iIterator __begin3;
  Bounds2i *__range3;
  vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
  sorted;
  Bounds2i pixelBounds;
  Image *image;
  ImageMetadata *metadata;
  ImageAndMetadata im;
  int i;
  bool list;
  bool csv;
  bool sort;
  value_type *in_stack_fffffffffffffa18;
  ImageAndMetadata *in_stack_fffffffffffffa20;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffa28;
  Bounds2iIterator *in_stack_fffffffffffffa30;
  allocator<char> *in_stack_fffffffffffffa50;
  float *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  allocator<char> *in_stack_fffffffffffffa68;
  allocator<char> *in_stack_fffffffffffffa70;
  Image *in_stack_fffffffffffffa78;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffa80;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  Bounds2i *in_stack_fffffffffffffa90;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  WrapMode in_stack_fffffffffffffaa4;
  WrapMode in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  int in_stack_fffffffffffffab0;
  Float in_stack_fffffffffffffab4;
  Image *in_stack_fffffffffffffab8;
  Image *in_stack_fffffffffffffb08;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  allocator<char> *local_470;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_458;
  Tuple2<pbrt::Point2,_int> local_428;
  Bounds2iIterator local_420;
  Bounds2iIterator local_410;
  Bounds2<int> *local_400;
  int local_3e4;
  int local_3e0;
  undefined4 local_3dc;
  int local_3d8;
  undefined1 local_3d1;
  ulong local_3d0;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_3c8;
  reference local_3c0;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *local_3b8;
  __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
  local_3b0;
  undefined1 *local_3a8;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *local_398;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *local_390;
  Bounds2iIterator local_388;
  Tuple2<pbrt::Point2,_int> local_300;
  Bounds2iIterator local_2f8;
  Bounds2iIterator local_2e8;
  Bounds2<int> *local_2d8;
  undefined1 local_2d0 [24];
  Tuple2<pbrt::Point2,_int> local_2b8;
  Bounds2<int> local_298;
  Image *local_288;
  undefined1 *local_280;
  allocator<char> local_251;
  string local_250 [32];
  Image local_230;
  undefined1 local_118 [256];
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  long local_10;
  int local_8;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI == 0) {
    usage("cat","no filenames provided to \"cat\"?");
  }
  BVar8.bounds = in_stack_fffffffffffffa90;
  BVar8.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffa98;
  local_11 = 0;
  local_12 = 0;
  local_13 = 0;
  local_18 = 0;
  do {
    if (local_8 <= local_18) {
      return 0;
    }
    iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"--sort");
    if (iVar3 == 0) {
LAB_003d3ff6:
      local_11 = (local_11 ^ 0xff) & 1;
    }
    else {
      iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"-sort");
      if (iVar3 == 0) goto LAB_003d3ff6;
      iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"--csv");
      if (iVar3 == 0) {
LAB_003d4057:
        local_12 = (local_12 ^ 0xff) & 1;
      }
      else {
        iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"-csv");
        if (iVar3 == 0) goto LAB_003d4057;
        iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"--list");
        if (iVar3 == 0) {
LAB_003d40b8:
          local_13 = (local_13 ^ 0xff) & 1;
        }
        else {
          iVar3 = strcmp(*(char **)(local_10 + (long)local_18 * 8),"-list");
          if (iVar3 == 0) goto LAB_003d40b8;
          if (((local_11 & 1) != 0) && ((local_12 & 1) != 0)) {
            fprintf(_stderr,"imgtool: --sort and --csv don\'t make sense to use together.\n");
            return 1;
          }
          if (((local_11 & 1) != 0) && ((local_13 & 1) != 0)) {
            fprintf(_stderr,"imgtool: --sort and --list don\'t make sense to use together.\n");
            return 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                     in_stack_fffffffffffffa50);
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffa20);
          pbrt::ColorEncodingHandle::TaggedPointer
                    ((ColorEncodingHandle *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
          pbrt::Image::Read((string *)im.image.p32.nAlloc,(Allocator)im.image.p32.nStored,
                            (ColorEncodingHandle *)im.image.p32.ptr);
          std::__cxx11::string::~string(local_250);
          std::allocator<char>::~allocator(&local_251);
          local_280 = local_118;
          local_288 = &local_230;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffffa20,
                     (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),(int)in_stack_fffffffffffffa18)
          ;
          local_2b8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_288);
          pbrt::Bounds2<int>::Bounds2
                    ((Bounds2<int> *)in_stack_fffffffffffffa30,
                     (Point2<int> *)in_stack_fffffffffffffa28,
                     (Point2<int> *)in_stack_fffffffffffffa20);
          BVar5 = pstd::optional<pbrt::Bounds2<int>_>::value_or
                            (in_stack_fffffffffffffa28,(Bounds2<int> *)in_stack_fffffffffffffa20);
          local_298 = BVar5;
          if ((local_11 & 1) == 0) {
            if ((local_13 & 1) == 0) {
              local_400 = &local_298;
              BVar8 = pbrt::begin((Bounds2i *)0x3d49cf);
              in_stack_fffffffffffffaa0 = BVar8.bounds._0_4_;
              in_stack_fffffffffffffaa4 = BVar8.bounds._4_4_;
              in_stack_fffffffffffffaa8 = BVar8.p.super_Tuple2<pbrt::Point2,_int>.x;
              in_stack_fffffffffffffaac = BVar8.p.super_Tuple2<pbrt::Point2,_int>.y;
              local_410 = BVar8;
              BVar8 = pbrt::end((Bounds2i *)in_stack_fffffffffffffa20);
              local_420 = BVar8;
              while( true ) {
                in_stack_fffffffffffffa8f =
                     pbrt::Bounds2iIterator::operator!=
                               (in_stack_fffffffffffffa30,
                                (Bounds2iIterator *)in_stack_fffffffffffffa28);
                if (!(bool)in_stack_fffffffffffffa8f) break;
                in_stack_fffffffffffffa80 =
                     (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_410);
                in_stack_fffffffffffffa78 = local_288;
                local_428 = in_stack_fffffffffffffa80;
                pbrt::Point2<int>::Point2
                          ((Point2<int> *)in_stack_fffffffffffffa20,
                           (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                           (int)in_stack_fffffffffffffa18);
                pbrt::WrapMode2D::WrapMode2D
                          ((WrapMode2D *)in_stack_fffffffffffffa30,
                           (WrapMode)((ulong)in_stack_fffffffffffffa28 >> 0x20));
                p_02.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffffb1f;
                p_02.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffffb18;
                pbrt::Image::GetChannels
                          (in_stack_fffffffffffffb08,p_02,(WrapMode2D)in_stack_fffffffffffffb10);
                if ((local_12 & 1) == 0) {
                  printf("(%d, %d): ",(ulong)local_428 & 0xffffffff,(ulong)local_428 >> 0x20);
                }
                local_470 = (allocator<char> *)0x0;
                while( true ) {
                  in_stack_fffffffffffffa68 = local_470;
                  in_stack_fffffffffffffa70 =
                       (allocator<char> *)
                       pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size
                                 (&local_458);
                  if (in_stack_fffffffffffffa70 <= in_stack_fffffffffffffa68) break;
                  in_stack_fffffffffffffa60 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                       operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18)
                  ;
                  in_stack_fffffffffffffa50 = local_470;
                  in_stack_fffffffffffffa58 =
                       (float *)pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                size(&local_458);
                  pbrt::Printf<float&,char>
                            ((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                             (char *)in_stack_fffffffffffffa50);
                  local_470 = local_470 + 1;
                }
                pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d4c2b);
                pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)in_stack_fffffffffffffa18);
              }
            }
            else {
              local_3d8 = pbrt::Image::NChannels((Image *)0x3d480a);
              local_3dc = 1;
              if (local_3d8 != 1) {
                pbrt::
                LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],int&,char_const(&)[2],int&>
                          (BVar8.bounds._4_4_,
                           (char *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                           in_stack_fffffffffffffa80.y,(char *)in_stack_fffffffffffffa78,
                           (char (*) [18])in_stack_fffffffffffffa70,
                           (char (*) [2])in_stack_fffffffffffffa68,
                           (char (*) [18])
                           CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                           (int *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                           (char (*) [2])
                           CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                           (int *)in_stack_fffffffffffffab8);
              }
              local_3d8 = 1;
              for (local_3e0 = local_298.pMin.super_Tuple2<pbrt::Point2,_int>.y;
                  local_3e0 < local_298.pMax.super_Tuple2<pbrt::Point2,_int>.y;
                  local_3e0 = local_3e0 + 1) {
                for (local_3e4 = local_298.pMin.super_Tuple2<pbrt::Point2,_int>.x;
                    local_3e4 < local_298.pMax.super_Tuple2<pbrt::Point2,_int>.x;
                    local_3e4 = local_3e4 + 1) {
                  in_stack_fffffffffffffab8 = local_288;
                  pbrt::Point2<int>::Point2
                            ((Point2<int> *)in_stack_fffffffffffffa20,
                             (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                             (int)in_stack_fffffffffffffa18);
                  pbrt::WrapMode2D::WrapMode2D
                            ((WrapMode2D *)in_stack_fffffffffffffa30,
                             (WrapMode)((ulong)in_stack_fffffffffffffa28 >> 0x20));
                  p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffab0;
                  p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaac;
                  wrapMode.wrap.values[1] = in_stack_fffffffffffffaa8;
                  wrapMode.wrap.values[0] = in_stack_fffffffffffffaa4;
                  in_stack_fffffffffffffab4 =
                       pbrt::Image::GetChannel
                                 ((Image *)BVar8.p.super_Tuple2<pbrt::Point2,_int>.
                                           super_Tuple2<pbrt::Point2,_int>,p_00,BVar8.bounds._4_4_,
                                  wrapMode);
                  printf("%f ",(double)in_stack_fffffffffffffab4);
                }
                printf("\n");
              }
            }
          }
          else {
            std::
            vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ::vector((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                      *)0x3d42e9);
            pbrt::Bounds2<int>::Area((Bounds2<int> *)in_stack_fffffffffffffa20);
            std::
            vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ::reserve((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       *)in_stack_fffffffffffffa60,(size_type)in_stack_fffffffffffffa58);
            local_2d8 = &local_298;
            BVar6 = pbrt::begin((Bounds2i *)0x3d4335);
            local_2e8 = BVar6;
            BVar7 = pbrt::end((Bounds2i *)in_stack_fffffffffffffa20);
            BVar6 = local_388;
            local_2f8 = BVar7;
            while( true ) {
              local_388 = BVar6;
              in_stack_fffffffffffffb1f =
                   pbrt::Bounds2iIterator::operator!=
                             (in_stack_fffffffffffffa30,
                              (Bounds2iIterator *)in_stack_fffffffffffffa28);
              if (!(bool)in_stack_fffffffffffffb1f) break;
              in_stack_fffffffffffffb10 =
                   (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_2e8);
              in_stack_fffffffffffffb08 = local_288;
              local_300 = in_stack_fffffffffffffb10;
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_fffffffffffffa20,
                         (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                         (int)in_stack_fffffffffffffa18);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffffa30,
                         (WrapMode)((ulong)in_stack_fffffffffffffa28 >> 0x20));
              p_01.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffffb1f;
              p_01.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffffb18;
              pbrt::Image::GetChannels
                        (in_stack_fffffffffffffb08,p_01,(WrapMode2D)in_stack_fffffffffffffb10);
              std::make_pair<pbrt::Point2<int>&,pbrt::ImageChannelValues&>
                        ((Point2<int> *)in_stack_fffffffffffffa28,
                         (ImageChannelValues *)in_stack_fffffffffffffa20);
              std::
              vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ::push_back((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
              std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>::~pair
                        ((pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)0x3d44b8);
              pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d44c5);
              BVar6 = pbrt::Bounds2iIterator::operator++
                                ((Bounds2iIterator *)in_stack_fffffffffffffa18);
            }
            local_390 = (pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)
                        std::
                        vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                        ::begin((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                                 *)in_stack_fffffffffffffa18);
            local_398 = (pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)
                        std::
                        vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                        ::end((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               *)in_stack_fffffffffffffa18);
            std::
            sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,cat(int,char**)::__0>
                      (local_390,local_398);
            local_3a8 = local_2d0;
            local_3b0._M_current =
                 (pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)
                 std::
                 vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                 ::begin((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                          *)in_stack_fffffffffffffa18);
            local_3b8 = (pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)
                        std::
                        vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                        ::end((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               *)in_stack_fffffffffffffa18);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
                                  *)in_stack_fffffffffffffa20,
                                 (__normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
                                  *)in_stack_fffffffffffffa18);
              if (!bVar2) break;
              local_3c0 = __gnu_cxx::
                          __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
                          ::operator*(&local_3b0);
              local_3c8 = &(local_3c0->second).
                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>;
              if ((local_12 & 1) == 0) {
                printf("(%d, %d): ",
                       (ulong)(uint)(local_3c0->first).super_Tuple2<pbrt::Point2,_int>.x,
                       (ulong)(uint)(local_3c0->first).super_Tuple2<pbrt::Point2,_int>.y);
              }
              local_3d0 = 0;
              while( true ) {
                uVar1 = local_3d0;
                sVar4 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                        size(local_3c8);
                if (sVar4 <= uVar1) break;
                pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                          ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                           in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
                uVar1 = local_3d0;
                sVar4 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                        size(local_3c8);
                local_3d1 = 0x2c;
                if (uVar1 == sVar4 - 1) {
                  local_3d1 = 10;
                }
                pbrt::Printf<float_const&,char>
                          ((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                           (char *)in_stack_fffffffffffffa50);
                local_3d0 = local_3d0 + 1;
              }
              __gnu_cxx::
              __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
              ::operator++(&local_3b0);
            }
            std::
            vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
            ::~vector((vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       *)in_stack_fffffffffffffa30);
          }
          pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffffa20);
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int cat(int argc, char *argv[]) {
    if (argc == 0)
        usage("cat", "no filenames provided to \"cat\"?");
    bool sort = false;
    bool csv = false;
    bool list = false;

    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "--sort") == 0 || strcmp(argv[i], "-sort") == 0) {
            sort = !sort;
            continue;
        }
        if (strcmp(argv[i], "--csv") == 0 || strcmp(argv[i], "-csv") == 0) {
            csv = !csv;
            continue;
        }
        if (strcmp(argv[i], "--list") == 0 || strcmp(argv[i], "-list") == 0) {
            list = !list;
            continue;
        }

        if (sort && csv) {
            fprintf(stderr, "imgtool: --sort and --csv don't make sense to use "
                            "together.\n");
            return 1;
        }
        if (sort && list) {
            fprintf(stderr, "imgtool: --sort and --list don't make sense to "
                            "use together.\n");
            return 1;
        }

        ImageAndMetadata im = Image::Read(argv[i]);
        ImageMetadata &metadata = im.metadata;
        Image &image = im.image;

        Bounds2i pixelBounds =
            metadata.pixelBounds.value_or(Bounds2i({0, 0}, image.Resolution()));
        if (sort) {
            std::vector<std::pair<Point2i, ImageChannelValues>> sorted;
            sorted.reserve(pixelBounds.Area());
            for (Point2i p : pixelBounds) {
                ImageChannelValues v = image.GetChannels(
                    {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                sorted.push_back(std::make_pair(p, v));
            }

            std::sort(sorted.begin(), sorted.end(),
                      [](const std::pair<Point2i, ImageChannelValues> &a,
                         const std::pair<Point2i, ImageChannelValues> &b) {
                          return a.second.Average() < b.second.Average();
                      });
            for (const auto &v : sorted) {
                const ImageChannelValues &values = v.second;
                if (!csv)
                    printf("(%d, %d): ", v.first.x, v.first.y);
                for (size_t i = 0; i < values.size(); ++i)
                    Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
            }
        } else {
            if (list) {
                CHECK_EQ(image.NChannels(), 1);
                for (int y = pixelBounds.pMin.y; y < pixelBounds.pMax.y; ++y) {
                    for (int x = pixelBounds.pMin.x; x < pixelBounds.pMax.x; ++x)
                        printf("%f ",
                               image.GetChannel(
                                   {x - pixelBounds.pMin.x, y - pixelBounds.pMin.y}, 0));
                    printf("\n");
                }
            } else {
                for (Point2i p : pixelBounds) {
                    ImageChannelValues values = image.GetChannels(
                        {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                    if (!csv)
                        printf("(%d, %d): ", p.x, p.y);
                    for (size_t i = 0; i < values.size(); ++i)
                        Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
                }
            }
        }
    }
    return 0;
}